

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::TableauPileWithCoveredTopCardTest_tryAddCardsOnCoveredTopCard_Test::TestBody
          (TableauPileWithCoveredTopCardTest_tryAddCardsOnCoveredTopCard_Test *this)

{
  initializer_list<solitaire::cards::Card> __l;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs_00;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher_00;
  AssertHelper local_110;
  Message local_108;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_100;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_e8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_b0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_98;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  Cards cardsLeftAfterAdding;
  allocator<solitaire::cards::Card> local_41;
  Card local_40;
  Card *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  Cards cardsToAdd;
  TableauPileWithCoveredTopCardTest_tryAddCardsOnCoveredTopCard_Test *this_local;
  
  cardsToAdd.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  solitaire::cards::Card::Card(&local_40,Nine,Diamond);
  local_30 = 1;
  local_38 = &local_40;
  std::allocator<solitaire::cards::Card>::allocator(&local_41);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28,__l
             ,&local_41);
  std::allocator<solitaire::cards::Card>::~allocator(&local_41);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             &gtest_ar.message_,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28);
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TableauPileWithCoveredTopCardTest).
                            super_InitializedTableauPileTest.super_EmptyTableauPileTest.pile);
  (*(peVar2->super_TableauPile).super_Archiver._vptr_Archiver[5])(peVar2,local_28);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_b0,(testing *)&gtest_ar.message_,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_98,(internal *)&local_b0,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_80,(char *)&local_98,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "cardsToAdd");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_98);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/TableauPileTests.cpp"
               ,0xc3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_100,
             (testing *)
             &(this->super_TableauPileWithCoveredTopCardTest).super_InitializedTableauPileTest.
              pileCards,rhs_00);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_e8,(internal *)&local_100,matcher_00);
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TableauPileWithCoveredTopCardTest).
                            super_InitializedTableauPileTest.super_EmptyTableauPileTest.pile);
  (*(peVar2->super_TableauPile).super_Archiver._vptr_Archiver[7])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_d0,(char *)&local_e8,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_e8);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/TableauPileTests.cpp"
               ,0xc4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             &gtest_ar.message_);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28);
  return;
}

Assistant:

TEST_F(TableauPileWithCoveredTopCardTest, tryAddCardsOnCoveredTopCard) {
    Cards cardsToAdd {
        Card {Value::Nine, Suit::Diamond}
    };
    const auto cardsLeftAfterAdding = cardsToAdd;

    pile->tryAddCards(cardsToAdd);

    EXPECT_THAT(cardsToAdd, ContainerEq(cardsLeftAfterAdding));
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
}